

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_step(sqlite3_stmt *pStmt)

{
  sqlite3 *db_00;
  int iVar1;
  int rc_00;
  uchar *z;
  char *pcVar2;
  char *zErr;
  int savedPc;
  sqlite3 *db;
  int cnt;
  Vdbe *v;
  int rc;
  sqlite3_stmt *pStmt_local;
  
  db._4_4_ = 0;
  iVar1 = vdbeSafetyNotNull((Vdbe *)pStmt);
  if (iVar1 == 0) {
    db_00 = *(sqlite3 **)pStmt;
    sqlite3_mutex_enter(db_00->mutex);
    while( true ) {
      iVar1 = db._4_4_;
      v._4_4_ = sqlite3Step((Vdbe *)pStmt);
      if (v._4_4_ == 0x11) {
        db._4_4_ = db._4_4_ + 1;
      }
      if (v._4_4_ != 0x11 || 0x31 < iVar1) goto LAB_001219ab;
      iVar1 = *(int *)(pStmt + 0x30);
      rc_00 = sqlite3Reprepare((Vdbe *)pStmt);
      if (rc_00 != 0) break;
      sqlite3_reset(pStmt);
      if (-1 < iVar1) {
        pStmt[0xc5] = (sqlite3_stmt)0xfe;
      }
    }
    z = sqlite3_value_text(db_00->pErr);
    sqlite3DbFree(db_00,*(void **)(pStmt + 0xa8));
    if (db_00->mallocFailed == '\0') {
      pcVar2 = sqlite3DbStrDup(db_00,(char *)z);
      *(char **)(pStmt + 0xa8) = pcVar2;
      v._4_4_ = sqlite3ApiExit(db_00,rc_00);
      *(int *)(pStmt + 0x34) = v._4_4_;
    }
    else {
      *(undefined8 *)(pStmt + 0xa8) = 0;
      v._4_4_ = 7;
      *(undefined4 *)(pStmt + 0x34) = 7;
    }
LAB_001219ab:
    sqlite3_mutex_leave(db_00->mutex);
    pStmt_local._4_4_ = v._4_4_;
  }
  else {
    pStmt_local._4_4_ = sqlite3MisuseError(0x1648f);
  }
  return pStmt_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_step(sqlite3_stmt *pStmt){
  int rc = SQLITE_OK;      /* Result from sqlite3Step() */
  Vdbe *v = (Vdbe*)pStmt;  /* the prepared statement */
  int cnt = 0;             /* Counter to prevent infinite loop of reprepares */
  sqlite3 *db;             /* The database connection */

  if( vdbeSafetyNotNull(v) ){
    return SQLITE_MISUSE_BKPT;
  }
  db = v->db;
  sqlite3_mutex_enter(db->mutex);
  while( (rc = sqlite3Step(v))==SQLITE_SCHEMA
         && cnt++ < SQLITE_MAX_SCHEMA_RETRY ){
    int savedPc = v->pc;
    rc = sqlite3Reprepare(v);
    if( rc!=SQLITE_OK ){
      /* This case occurs after failing to recompile an sql statement.
      ** The error message from the SQL compiler has already been loaded
      ** into the database handle. This block copies the error message
      ** from the database handle into the statement and sets the statement
      ** program counter to 0 to ensure that when the statement is
      ** finalized or reset the parser error message is available via
      ** sqlite3_errmsg() and sqlite3_errcode().
      */
      const char *zErr = (const char *)sqlite3_value_text(db->pErr);
      sqlite3DbFree(db, v->zErrMsg);
      if( !db->mallocFailed ){
        v->zErrMsg = sqlite3DbStrDup(db, zErr);
        v->rc = rc = sqlite3ApiExit(db, rc);
      } else {
        v->zErrMsg = 0;
        v->rc = rc = SQLITE_NOMEM_BKPT;
      }
      break;
    }
    sqlite3_reset(pStmt);
    if( savedPc>=0 ){
      /* Setting minWriteFileFormat to 254 is a signal to the OP_Init and
      ** OP_Trace opcodes to *not* perform SQLITE_TRACE_STMT because it has
      ** already been done once on a prior invocation that failed due to
      ** SQLITE_SCHEMA.   tag-20220401a  */
      v->minWriteFileFormat = 254;
    }
    assert( v->expired==0 );
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}